

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_horde_bear(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RSI;
  int in_stack_000000bc;
  CHAR_DATA *in_stack_000000c0;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  CHAR_DATA *in_stack_ffffffffffffffd0;
  
  bVar1 = is_affected(in_RSI,(int)gsn_rage);
  if ((bVar1) && (in_RSI->fighting != (CHAR_DATA *)0x0)) {
    iVar2 = number_percent();
    iVar3 = get_skill(in_stack_000000c0,in_stack_000000bc);
    if ((double)iVar2 <= (double)iVar3 * 0.15) {
      act((char *)in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act((char *)in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act((char *)in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      WAIT_STATE(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
                 in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368
                 ,in_stack_00001370,in_stack_00001378);
    }
  }
  return;
}

Assistant:

void fight_prog_horde_bear(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.15 * get_skill(ch, gsn_rage)))
		return;

	act("The rage of the Bear roars through you as you charge into $N, sending $m sprawling!", ch, 0, ch->fighting, TO_CHAR);
	act("$n gets a wild look in $s eyes, charging into you and sending you sprawling!", ch, 0, ch->fighting, TO_VICT);
	act("$n gets a wild look in $s eyes, charging into $N and sending $m sprawling!", ch, 0, ch->fighting, TO_NOTVICT);

	WAIT_STATE(ch->fighting, (int)(PULSE_VIOLENCE * 1.9));

	damage_new(ch, ch->fighting, dice(8, 8), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "charge");
}